

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

FFSTypeHandle_conflict FFSset_fixed_target(FFSContext c,FMStructDescList struct_list)

{
  FFSTypeHandle_conflict p_Var1;
  FFSContext in_RDI;
  FFSTypeHandle_conflict handle;
  int index;
  FMFormat_conflict fmf;
  FMStructDescList in_stack_00000050;
  FMContext in_stack_00000058;
  
  register_data_format(in_stack_00000058,in_stack_00000050);
  p_Var1 = FFSTypeHandle_by_index((FFSContext)struct_list,fmf._4_4_);
  p_Var1->is_fixed_target = 1;
  reset_prior_conversions(in_RDI);
  return p_Var1;
}

Assistant:

extern FFSTypeHandle
FFSset_fixed_target(FFSContext c, FMStructDescList struct_list)
{
    FMFormat fmf = register_data_format(c->fmc, struct_list);
    int index;
    FFSTypeHandle handle;
    index = fmf->format_index;
    handle = FFSTypeHandle_by_index(c, index);
    handle->is_fixed_target = 1;
    /* any new target may invalidate prior conversion decisions */
    reset_prior_conversions(c);
    return handle;
}